

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_fetching.c
# Opt level: O0

greatest_test_res db_all_frequencies_fetch(void)

{
  uint uVar1;
  int iVar2;
  int local_60;
  int i;
  int retrieved_count;
  frequency_t *records;
  feed_db_t db;
  frequency_t *pfStack_20;
  int expected_count;
  frequency_t *expected;
  FILE *fp;
  
  expected = (frequency_t *)fopen("../tests/data/stupid_gtfs/frequencies.txt","r");
  if ((FILE *)expected == (FILE *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
    ;
    greatest_info.fail_line = 0xd8;
    greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/frequencies.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    db._36_4_ = read_all_frequencies((FILE *)expected,&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (db._36_4_ == 0xb) {
      init_feed_db((feed_db_t *)&records,"tests_storing.db",1);
      setup_feed_db((feed_db_t *)&records);
      uVar1 = fetch_all_frequencies_db((feed_db_t *)&records,(frequency_t **)&i);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (db._36_4_ == uVar1) {
        for (local_60 = 0; local_60 < (int)uVar1; local_60 = local_60 + 1) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = equal_frequency(pfStack_20 + local_60,_i + local_60);
          if (iVar2 == 0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
            ;
            greatest_info.fail_line = 0xea;
            greatest_info.msg = "equal_frequency(&(expected[i]), &(records[i]))";
            if ((greatest_info.flags & 4) == 0) {
              greatest_info.fail_line = 0xea;
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
              ;
              greatest_info.msg = "equal_frequency(&(expected[i]), &(records[i]))";
              return GREATEST_TEST_RES_FAIL;
            }
            abort();
          }
        }
        free_feed_db((feed_db_t *)&records);
        if (0 < (int)uVar1) {
          free(_i);
        }
        if (0 < (int)db._36_4_) {
          free(pfStack_20);
        }
        if (expected != (frequency_t *)0x0) {
          fclose((FILE *)expected);
        }
        greatest_info.msg = (char *)0x0;
        fp._4_4_ = GREATEST_TEST_RES_PASS;
      }
      else {
        fprintf(_stdout,"\nExpected: ");
        fprintf(_stdout,"%i",(ulong)(uint)db._36_4_);
        fprintf(_stdout,"\n     Got: ");
        fprintf(_stdout,"%i",(ulong)uVar1);
        fprintf(_stdout,"\n");
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0xe8;
        greatest_info.msg = "expected_count != retrieved_count";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      fprintf(_stdout,"\nExpected: ");
      fprintf(_stdout,"%i",0xb);
      fprintf(_stdout,"\n     Got: ");
      fprintf(_stdout,"%i",(ulong)(uint)db._36_4_);
      fprintf(_stdout,"\n");
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      greatest_info.fail_line = 0xdd;
      greatest_info.msg = "11 != expected_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST db_all_frequencies_fetch(void) {

    FILE *fp = fopen("../tests/data/stupid_gtfs/frequencies.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/stupid_gtfs/frequencies.txt` test file");
    } else {
        frequency_t *expected;
        int expected_count = read_all_frequencies(fp, &expected);

        ASSERT_EQ_FMT(11, expected_count, "%i");


        feed_db_t db;
        frequency_t *records;

        init_feed_db(&db, "tests_storing.db", 1);
        setup_feed_db(&db);

        int retrieved_count = fetch_all_frequencies_db(&db, &records);

        ASSERT_EQ_FMT(expected_count, retrieved_count, "%i");
        for (int i = 0; i < retrieved_count; i++)
            ASSERT(equal_frequency(&(expected[i]), &(records[i])));


        free_feed_db(&db);
        if (retrieved_count > 0) free(records);
        if (expected_count > 0) free(expected);
        if (fp) fclose(fp);
    }
    PASS();
}